

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_primary(LexState *ls,ExpDesc *v)

{
  BCLine line_00;
  FuncState *fs_00;
  FuncState *fs_01;
  GCstr *name;
  undefined1 local_58 [8];
  ExpDesc key_1;
  ExpDesc key;
  BCLine line;
  FuncState *fs;
  ExpDesc *v_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  if (ls->tok == 0x28) {
    line_00 = ls->linenumber;
    lj_lex_next(ls);
    expr(ls,v);
    lex_match(ls,0x29,0x28,line_00);
    expr_discharge(ls->fs,v);
  }
  else {
    if ((ls->tok != 0x11f) && (ls->tok != 0x10a)) {
      err_syntax(ls,LJ_ERR_XSYMBOL);
    }
    fs_01 = ls->fs;
    name = lex_str(ls);
    var_lookup_(fs_01,name,v,1);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while (ls->tok == 0x2e) {
          expr_field(ls,v);
        }
        if (ls->tok != 0x5b) break;
        expr_toanyreg(fs_00,v);
        expr_bracket(ls,(ExpDesc *)&key_1.f);
        expr_index(fs_00,v,(ExpDesc *)&key_1.f);
      }
      if (ls->tok != 0x3a) break;
      lj_lex_next(ls);
      expr_str(ls,(ExpDesc *)local_58);
      bcemit_method(fs_00,v,(ExpDesc *)local_58);
      parse_args(ls,v);
    }
    if (((ls->tok != 0x28) && (ls->tok != 0x120)) && (ls->tok != 0x7b)) break;
    expr_tonextreg(fs_00,v);
    bcreg_reserve(fs_00,1);
    parse_args(ls,v);
  }
  return;
}

Assistant:

static void expr_primary(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  /* Parse prefix expression. */
  if (ls->tok == '(') {
    BCLine line = ls->linenumber;
    lj_lex_next(ls);
    expr(ls, v);
    lex_match(ls, ')', '(', line);
    expr_discharge(ls->fs, v);
  } else if (ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) {
    var_lookup(ls, v);
  } else {
    err_syntax(ls, LJ_ERR_XSYMBOL);
  }
  for (;;) {  /* Parse multiple expression suffixes. */
    if (ls->tok == '.') {
      expr_field(ls, v);
    } else if (ls->tok == '[') {
      ExpDesc key;
      expr_toanyreg(fs, v);
      expr_bracket(ls, &key);
      expr_index(fs, v, &key);
    } else if (ls->tok == ':') {
      ExpDesc key;
      lj_lex_next(ls);
      expr_str(ls, &key);
      bcemit_method(fs, v, &key);
      parse_args(ls, v);
    } else if (ls->tok == '(' || ls->tok == TK_string || ls->tok == '{') {
      expr_tonextreg(fs, v);
      if (LJ_FR2) bcreg_reserve(fs, 1);
      parse_args(ls, v);
    } else {
      break;
    }
  }
}